

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_ASTVisitor.h
# Opt level: O1

ASTObject * __thiscall
soul::RewritingASTVisitor::visit(RewritingASTVisitor *this,EndpointDeclaration *e)

{
  EndpointDetails *pEVar1;
  size_t sVar2;
  ChildEndpointPath *pCVar3;
  pool_ref<soul::AST::Expression> *type;
  pool_ref<soul::AST::Expression> *e_00;
  long lVar4;
  pool_ptr<soul::AST::Expression> *e_01;
  
  pEVar1 = (e->details).object;
  if (pEVar1 != (EndpointDetails *)0x0) {
    sVar2 = (pEVar1->dataTypes).numActive;
    if (sVar2 != 0) {
      e_00 = (pEVar1->dataTypes).items;
      lVar4 = sVar2 << 3;
      do {
        replaceExpression(this,e_00);
        e_00 = e_00 + 1;
        lVar4 = lVar4 + -8;
      } while (lVar4 != 0);
    }
    replaceExpression(this,&pEVar1->arraySize);
  }
  pCVar3 = (e->childPath).object;
  if ((pCVar3 != (ChildEndpointPath *)0x0) && (sVar2 = (pCVar3->sections).numActive, sVar2 != 0)) {
    e_01 = &((pCVar3->sections).items)->index;
    lVar4 = sVar2 << 4;
    do {
      replaceExpression(this,e_01);
      e_01 = e_01 + 2;
      lVar4 = lVar4 + -0x10;
    } while (lVar4 != 0);
  }
  (*this->_vptr_RewritingASTVisitor[8])(this,&e->annotation);
  return &e->super_ASTObject;
}

Assistant:

virtual AST::ASTObject& visit (AST::EndpointDeclaration& e)
    {
        if (auto details = e.details.get())
        {
            for (auto& type : details->dataTypes)
                replaceExpression (type);

            replaceExpression (details->arraySize);
        }

        if (e.childPath != nullptr)
            for (auto& p : e.childPath->sections)
                replaceExpression (p.index);

        visit (e.annotation);
        return e;
    }